

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

void jp2_write_jp(opj_cio_t *cio)

{
  int pos;
  int iVar1;
  opj_cio_t *in_RDI;
  opj_jp2_box_t box;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  pos = cio_tell(in_RDI);
  cio_skip(in_RDI,4);
  cio_write(in_RDI,CONCAT44(pos,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  cio_write(in_RDI,CONCAT44(pos,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  iVar1 = cio_tell(in_RDI);
  iVar1 = iVar1 - pos;
  cio_seek(in_RDI,pos);
  cio_write(in_RDI,CONCAT44(pos,in_stack_fffffffffffffff0),iVar1);
  cio_seek(in_RDI,pos + iVar1);
  return;
}

Assistant:

static void jp2_write_jp(opj_cio_t *cio) {
	opj_jp2_box_t box;

	box.init_pos = cio_tell(cio);
	cio_skip(cio, 4);
	cio_write(cio, JP2_JP, 4);		/* JP2 signature */
	cio_write(cio, 0x0d0a870a, 4);

	box.length = cio_tell(cio) - box.init_pos;
	cio_seek(cio, box.init_pos);
	cio_write(cio, box.length, 4);	/* L */
	cio_seek(cio, box.init_pos + box.length);
}